

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O1

void vociren(voccxdef *ctx,objnum oldnum,objnum newnum)

{
  byte *pbVar1;
  ulong uVar2;
  vocdef **ppvVar3;
  int iVar4;
  undefined6 in_register_00000012;
  vocdef *pvVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar6 = CONCAT62(in_register_00000032,oldnum) & 0xffffffff;
  vocialo(ctx,newnum);
  uVar2 = uVar6 >> 8;
  uVar8 = (ulong)(((uint)CONCAT62(in_register_00000032,oldnum) & 0xff) << 3);
  uVar10 = CONCAT62(in_register_00000012,newnum) >> 8 & 0xffffff;
  uVar11 = (ulong)(((uint)CONCAT62(in_register_00000012,newnum) & 0xff) << 3);
  *(undefined8 *)((long)ctx->voccxinh[uVar10] + uVar11) =
       *(undefined8 *)((long)ctx->voccxinh[uVar2] + uVar8);
  *(undefined8 *)((long)ctx->voccxinh[uVar2] + uVar8) = 0;
  pbVar1 = (byte *)(*(long *)((long)ctx->voccxinh[uVar10] + uVar11) + 8);
  *pbVar1 = *pbVar1 | 1;
  ppvVar3 = ctx->voccxhsh;
  iVar4 = 0x100;
  do {
    for (pvVar5 = *ppvVar3; pvVar5 != (vocdef *)0x0; pvVar5 = pvVar5->vocnxt) {
      uVar7 = pvVar5->vocwlst;
      while( true ) {
        if (uVar7 == 0xffffffff) {
          puVar9 = (uint *)0x0;
        }
        else {
          puVar9 = (uint *)((long)&ctx->voccxwp[(ulong)uVar7 / 2000]->vocwnxt +
                           (ulong)((uVar7 % 2000) * 8));
        }
        if (puVar9 == (uint *)0x0) break;
        if ((short)puVar9[1] == (short)uVar6) {
          *(objnum *)(puVar9 + 1) = newnum;
          *(byte *)((long)puVar9 + 7) = *(byte *)((long)puVar9 + 7) | 1;
        }
        uVar7 = *puVar9;
      }
    }
    ppvVar3 = ppvVar3 + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void vociren(voccxdef *ctx, objnum oldnum, objnum newnum)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;


    /* make sure we have a page table entry for the original object */
    vocialo(ctx, newnum);

    /* move the old object's inheritance record to the new slot */
    vocinh(ctx, newnum) = vocinh(ctx, oldnum);
    vocinh(ctx, oldnum) = 0;

    /* make the old object an honorary class object */
    vocinh(ctx, newnum)->vociflg |= VOCIFCLASS;

    /* 
     *   Renumber any vocabulary associated with the old object to the new
     *   object.
     */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i != 0 ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v != 0 ; v = v->vocnxt)
        {
            /* go through all vocwdef's defined for this word */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                /* 
                 *   renumber this word and mark it as being associated
                 *   with a class if it's associated with the original
                 *   object 
                 */
                if (vw->vocwobj == oldnum)
                {
                    vw->vocwobj = newnum;
                    vw->vocwflg |= VOCFCLASS;
                }
            }
        }
    }
}